

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_session_flag(LIBSSH2_SESSION *session,int flag,int value)

{
  int iVar1;
  
  iVar1 = -0x22;
  if (flag - 1U < 3) {
    *(int *)(session->server_hostkey_sha1 + (ulong)(flag - 1U) * 4 + -0x50) = value;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_session_flag(LIBSSH2_SESSION * session, int flag, int value)
{
    switch(flag) {
    case LIBSSH2_FLAG_SIGPIPE:
        session->flag.sigpipe = value;
        break;
    case LIBSSH2_FLAG_COMPRESS:
        session->flag.compress = value;
        break;
    case LIBSSH2_FLAG_QUOTE_PATHS:
        session->flag.quote_paths = value;
        break;
    default:
        /* unknown flag */
        return LIBSSH2_ERROR_INVAL;
    }

    return LIBSSH2_ERROR_NONE;
}